

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QIconModeViewBase::scrollContentsBy(QIconModeViewBase *this,int dx,int dy,bool scrollElasticBand)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  bool bVar1;
  undefined7 in_register_00000009;
  int dx_00;
  long in_FS_OFFSET;
  QRect local_48;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,scrollElasticBand) != 0) {
    this_00 = (this->super_QCommonListViewBase).dd;
    bVar1 = QCommonListViewBase::isRightToLeft(&this->super_QCommonListViewBase);
    dx_00 = -dx;
    if (!bVar1) {
      dx_00 = dx;
    }
    QListViewPrivate::scrollElasticBandBy(this_00,dx_00,dy);
  }
  QCommonListViewBase::scrollContentsBy(&this->super_QCommonListViewBase,dx,dy,false);
  if ((this->draggedItems).d.size != 0) {
    this_01 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
              super_QAbstractScrollAreaPrivate.viewport;
    local_48 = draggedItemsRect(this);
    local_38 = QRect::translated(&local_48,dx,dy);
    QWidget::update(this_01,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::scrollContentsBy(int dx, int dy, bool scrollElasticBand)
{
    if (scrollElasticBand)
        dd->scrollElasticBandBy(isRightToLeft() ? -dx : dx, dy);

    QCommonListViewBase::scrollContentsBy(dx, dy, scrollElasticBand);
    if (!draggedItems.isEmpty())
        viewport()->update(draggedItemsRect().translated(dx, dy));
}